

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

AppendResult __thiscall
metaf::WeatherGroup::append
          (WeatherGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  optional<metaf::MetafTime> *poVar1;
  IncompleteText IVar2;
  ulong uVar3;
  int iVar4;
  optional<metaf::WeatherPhenomena> wp;
  undefined2 local_58;
  undefined1 local_56;
  _Storage<metaf::WeatherPhenomena,_true> local_54;
  char local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  IVar2 = this->incompleteText;
  if (IVar2 == TSLTNG_TEMPO) {
LAB_001a9325:
    iVar4 = std::__cxx11::string::compare((char *)group);
    if (iVar4 == 0) {
      this->incompleteText = NONE;
      return APPENDED;
    }
    return GROUP_INVALIDATED;
  }
  if (IVar2 == TSLTNG) {
    iVar4 = std::__cxx11::string::compare((char *)group);
    if (iVar4 == 0) {
      this->incompleteText = TSLTNG_TEMPO;
      return APPENDED;
    }
    return GROUP_INVALIDATED;
  }
  if (IVar2 == WX) goto LAB_001a9325;
  if (RECENT < this->t) {
    return NOT_APPENDED;
  }
  if (reportPart - RMK < 0xfffffffe) {
    return NOT_APPENDED;
  }
  if (reportPart == METAR) {
    iVar4 = std::__cxx11::string::compare((char *)group);
    if (iVar4 == 0) {
      local_54._M_value.data = 0x400001;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)group);
      if (iVar4 != 0) {
        WeatherPhenomena::fromString
                  ((optional<metaf::WeatherPhenomena> *)&local_54._M_value,group,true);
        if (local_3c != '\x01') {
          return NOT_APPENDED;
        }
        goto LAB_001a93f0;
      }
      local_54._M_value.data = 0x400000;
    }
    local_54._M_value.tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged = false;
  }
  else {
    WeatherPhenomena::fromString((optional<metaf::WeatherPhenomena> *)&local_54._M_value,group,true)
    ;
    if (local_3c == '\0') {
      return NOT_APPENDED;
    }
    if ((local_54._M_value.data & 7) == 1) {
      return NOT_APPENDED;
    }
LAB_001a93f0:
    local_38 = local_54._4_8_;
    uStack_30 = local_54._12_8_;
    local_58 = local_54._21_2_;
    local_56 = local_54._23_1_;
  }
  if (this->t == RECENT) {
    if ((local_54._M_value.data & 7) != 1) {
      return NOT_APPENDED;
    }
  }
  else if ((this->t == CURRENT) && ((local_54._M_value.data & 7) == 1)) {
    return NOT_APPENDED;
  }
  uVar3 = this->wsz;
  if (uVar3 < 0x14) {
    this->wsz = uVar3 + 1;
    this->w[uVar3].data = local_54._M_value.data;
    poVar1 = &this->w[uVar3].tm;
    (poVar1->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_payload._M_value.dayValue =
         (optional<unsigned_int>)local_38;
    *(undefined8 *)
     ((long)&(poVar1->super__Optional_base<metaf::MetafTime,_true,_true>)._M_payload.
             super__Optional_payload_base<metaf::MetafTime>._M_payload + 8) = uStack_30;
    this->w[uVar3].tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>._M_engaged =
         local_54._M_value.tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged;
    *(undefined2 *)
     &this->w[uVar3].tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::MetafTime>.field_0x11 = local_58;
    this->w[uVar3].tm.super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
    super__Optional_payload_base<metaf::MetafTime>.field_0x13 = local_56;
  }
  return (uint)(0x13 < uVar3);
}

Assistant:

AppendResult WeatherGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	switch (incompleteText) {
		case IncompleteText::NONE:
		break;

		case IncompleteText::WX:
		if (group != "MISG") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE; 
		return AppendResult::APPENDED;

		case IncompleteText::TSLTNG:
		if (group != "TEMPO") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::TSLTNG_TEMPO; 
		return AppendResult::APPENDED;

		case IncompleteText::TSLTNG_TEMPO:
		if (group != "UNAVBL") return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::APPENDED;
	}

	if (type() != Type::CURRENT && type() != Type::RECENT)
		return AppendResult::NOT_APPENDED;

	const auto wp = parseWeatherWithoutEvent(group, reportPart);
	if (wp.has_value()) {
		// Recent weather cannot be appended to current weather and vice versa
		if (type() == Type::CURRENT && 
			wp->qualifier() == WeatherPhenomena::Qualifier::RECENT) return AppendResult::NOT_APPENDED;
		if (type() == Type::RECENT && 
			wp->qualifier() != WeatherPhenomena::Qualifier::RECENT) return AppendResult::NOT_APPENDED;

		if (!addWeatherPhenomena(*wp)) return AppendResult::NOT_APPENDED;
		return AppendResult::APPENDED;
	}
	return AppendResult::NOT_APPENDED;
}